

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool.h
# Opt level: O2

void mempool_create(mempool *pool,slab_cache *cache,uint32_t objsize)

{
  int iVar1;
  byte order;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = 0x70;
  if (0x70 < (uint)pool) {
    uVar3 = (ulong)pool & 0xffffffff;
  }
  uVar4 = (ulong)((double)uVar3 / 0.01);
  uVar4 = (long)((double)uVar3 / 0.01 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4;
  if ((::cache.arena)->slab_size <= uVar4) {
    uVar4 = (ulong)(::cache.arena)->slab_size;
  }
  if (::cache.order0_size < uVar4) {
    uVar2 = (int)uVar4 - 1;
    iVar1 = 0x1f;
    if (uVar2 != 0) {
      for (; uVar2 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    order = 0x20 - (((byte)iVar1 ^ 0x1f) + ::cache.order0_size_lb);
    if (::cache.order_max < order) {
      __assert_fail("order <= cache->order_max",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/mempool.h"
                    ,0xfe,"void mempool_create(struct mempool *, struct slab_cache *, uint32_t)");
    }
  }
  else {
    order = 0;
  }
  mempool_create_with_order(&::pool,&::cache,(uint)pool,order);
  return;
}

Assistant:

static inline void
mempool_create(struct mempool *pool, struct slab_cache *cache,
	       uint32_t objsize)
{
	size_t overhead = (objsize > sizeof(struct mslab) ?
			   objsize : sizeof(struct mslab));
	size_t slab_size = (size_t) (overhead / OVERHEAD_RATIO);
	if (slab_size > cache->arena->slab_size)
		slab_size = cache->arena->slab_size;
	/*
	 * Calculate the amount of usable space in a slab.
	 * @note: this asserts that slab_size_min is less than
	 * SLAB_ORDER_MAX.
	 */
	uint8_t order = slab_order(cache, slab_size);
	assert(order <= cache->order_max);
	return mempool_create_with_order(pool, cache, objsize, order);
}